

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ResultBuilder * __thiscall
Catch::
ExpressionLhs<kp::tree<htmlcxx2::HTML::Node,std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>>>::pre_order_iterator_const&>
::
captureExpression<(Catch::Internal::Operator)0,kp::tree<htmlcxx2::HTML::Node,std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>>>::pre_order_iterator>
          (ExpressionLhs<kp::tree<htmlcxx2::HTML::Node,std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>>>::pre_order_iterator_const&>
           *this,pre_order_iterator *rhs)

{
  ResultBuilder *pRVar1;
  StringMakerBase<true> *this_00;
  OfType OVar2;
  pre_order_iterator *in_RDX;
  pre_order_iterator *_value;
  long *local_78 [2];
  long local_68 [2];
  string local_58;
  string local_38;
  
  pRVar1 = *(ResultBuilder **)this;
  this_00 = *(StringMakerBase<true> **)(this + 8);
  OVar2 = ExpressionFailed;
  if ((rhs->super_iterator_base).node == *(tree_node **)this_00) {
    OVar2 = Ok;
  }
  (pRVar1->m_data).resultType = OVar2;
  Detail::StringMakerBase<true>::
  convert<kp::tree<htmlcxx2::HTML::Node,std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>>>::pre_order_iterator>
            (&local_38,this_00,in_RDX);
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).lhs);
  Detail::StringMakerBase<true>::
  convert<kp::tree<htmlcxx2::HTML::Node,std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>>>::pre_order_iterator>
            (&local_58,(StringMakerBase<true> *)rhs,_value);
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).rhs);
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"==","");
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).op);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }